

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O1

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintThreeBBShaft>::create
          (ChClassRegistration<chrono::ChConstraintThreeBBShaft> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x140);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 5) = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 1;
  *(undefined4 *)(puVar1 + 6) = 1;
  puVar1[7] = 0;
  *(undefined1 (*) [16])(puVar1 + 9) = ZEXT416(0) << 0x40;
  puVar1[0xb] = 0;
  *puVar1 = &PTR__ChConstraint_00b63240;
  return puVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }